

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

void __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
::
build_match<chaiscript::eval::Prefix_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>
          (ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
           *this,size_t t_match_start,string *t_text)

{
  bool is_deep;
  vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
  new_children;
  Parse_Location filepos;
  bool local_71;
  long *local_70;
  _Head_base<0UL,_chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_*,_false>
  local_68;
  unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
  local_60;
  anon_class_24_3_3a5bb1e9 local_58;
  Parse_Location local_40;
  
  local_58.t_match_start = (size_t *)&local_60;
  local_58.is_deep = &local_71;
  local_71 = false;
  local_60._M_t.
  super___uniq_ptr_impl<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_*,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
  .
  super__Head_base<0UL,_chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>,_true,_true>
        )(__uniq_ptr_data<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>,_true,_true>
          )t_match_start;
  local_58.this =
       (ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
        *)this;
  ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
  ::
  build_match<chaiscript::eval::Prefix_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>
  ::anon_class_24_3_3a5bb1e9::operator()(&local_40,&local_58);
  local_58.is_deep = (bool *)0x0;
  local_58.t_match_start = (size_t *)0x0;
  local_58.this =
       (ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
        *)0x0;
  if (local_71 == true) {
    std::
    vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>,std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>>>
    ::
    _M_assign_aux<std::move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>*,std::vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>,std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>>>>>>
              ((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>,std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>>>
                *)&local_58,
               (long)(int)local_60._M_t.
                          super___uniq_ptr_impl<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_*,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
                          .
                          super__Head_base<0UL,_chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_*,_false>
                          ._M_head_impl * 8 + *(long *)(this + 0x20),*(undefined8 *)(this + 0x28));
    Catch::clara::std::
    vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
    ::erase((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
             *)(this + 0x20),
            (unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
             *)((long)(int)local_60._M_t.
                           super___uniq_ptr_impl<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_*,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
                           .
                           super__Head_base<0UL,_chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_*,_false>
                           ._M_head_impl * 8 + *(long *)(this + 0x20)),
            *(unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
              **)(this + 0x28));
  }
  make_unique<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,chaiscript::eval::Prefix_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::__cxx11::string,chaiscript::Parse_Location,std::vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>,std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>>>>
            ((chaiscript *)&local_70,t_text,&local_40,
             (vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
              *)&local_58);
  optimizer::
  Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>
  ::optimize<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
            ((Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>
              *)&local_68,
             (AST_Node_Impl_Ptr<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
             (this + 0x59));
  std::
  vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>,std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>>>
  ::
  emplace_back<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>>
            ((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>,std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>>>
              *)(this + 0x20),
             (unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
              *)&local_68);
  if (local_68._M_head_impl !=
      (AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)0x0) {
    (*((local_68._M_head_impl)->super_AST_Node)._vptr_AST_Node[3])();
  }
  local_68._M_head_impl =
       (AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)0x0;
  if (local_70 != (long *)0x0) {
    (**(code **)(*local_70 + 0x18))();
  }
  local_70 = (long *)0x0;
  Catch::clara::std::
  vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
  ::~vector((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
             *)&local_58);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.filename.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void build_match(size_t t_match_start, std::string t_text = "") {
        bool is_deep = false;

        Parse_Location filepos = [&]() -> Parse_Location {
          // so we want to take everything to the right of this and make them children
          if (t_match_start != m_match_stack.size()) {
            is_deep = true;
            return Parse_Location(m_filename,
                                  m_match_stack[t_match_start]->location.start.line,
                                  m_match_stack[t_match_start]->location.start.column,
                                  m_position.line,
                                  m_position.col);
          } else {
            return Parse_Location(m_filename, m_position.line, m_position.col, m_position.line, m_position.col);
          }
        }();

        std::vector<eval::AST_Node_Impl_Ptr<Tracer>> new_children;

        if (is_deep) {
          new_children.assign(std::make_move_iterator(m_match_stack.begin() + static_cast<int>(t_match_start)),
                              std::make_move_iterator(m_match_stack.end()));
          m_match_stack.erase(m_match_stack.begin() + static_cast<int>(t_match_start), m_match_stack.end());
        }

        /// \todo fix the fact that a successful match that captured no ast_nodes doesn't have any real start position
        m_match_stack.push_back(
            m_optimizer.optimize(chaiscript::make_unique<chaiscript::eval::AST_Node_Impl<Tracer>, NodeType>(std::move(t_text),
                                                                                                            std::move(filepos),
                                                                                                            std::move(new_children))));
      }